

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_cmp_iso9660_identifier(isoent *p1,isoent *p2)

{
  byte *pbVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  long in_RSI;
  long in_RDI;
  int l;
  int cmp;
  char *s2;
  char *s1;
  int local_30;
  int local_2c;
  byte *local_28;
  byte *local_20;
  int local_4;
  
  pvVar2 = *(void **)(in_RDI + 0xa8);
  pvVar3 = *(void **)(in_RSI + 0xa8);
  local_30 = *(int *)(in_RDI + 0xb0);
  if (*(int *)(in_RSI + 0xb0) < local_30) {
    local_30 = *(int *)(in_RSI + 0xb0);
  }
  local_2c = memcmp(pvVar2,pvVar3,(long)local_30);
  local_4 = local_2c;
  if (local_2c == 0) {
    if (*(int *)(in_RDI + 0xb0) < *(int *)(in_RSI + 0xb0)) {
      lVar4 = (long)local_30;
      local_30 = *(int *)(in_RSI + 0xb0) - *(int *)(in_RDI + 0xb0);
      pbVar1 = (byte *)((long)pvVar3 + lVar4);
      do {
        local_28 = pbVar1;
        if (local_30 == 0) goto LAB_00187090;
        local_30 = local_30 + -1;
        pbVar1 = local_28 + 1;
      } while (*local_28 == 0x20);
      local_4 = 0x20 - (uint)*local_28;
    }
    else if (*(int *)(in_RSI + 0xb0) < *(int *)(in_RDI + 0xb0)) {
      lVar4 = (long)local_30;
      local_30 = *(int *)(in_RDI + 0xb0) - *(int *)(in_RSI + 0xb0);
      pbVar1 = (byte *)((long)pvVar2 + lVar4);
      do {
        local_20 = pbVar1;
        if (local_30 == 0) goto LAB_00187090;
        local_30 = local_30 + -1;
        pbVar1 = local_20 + 1;
      } while (*local_20 == 0x20);
      local_4 = *local_20 - 0x20;
    }
    else {
LAB_00187090:
      if ((*(int *)(in_RDI + 0xb4) == 0) && (*(int *)(in_RSI + 0xb4) == 0)) {
        local_4 = 0;
      }
      else if ((*(int *)(in_RDI + 0xb4) == 1) && (*(int *)(in_RSI + 0xb4) == 1)) {
        local_4 = 0;
      }
      else if (*(int *)(in_RDI + 0xb4) < 2) {
        local_4 = -1;
      }
      else if (*(int *)(in_RSI + 0xb4) < 2) {
        local_4 = 1;
      }
      else {
        local_30 = *(int *)(in_RDI + 0xb4);
        if (*(int *)(in_RSI + 0xb4) < local_30) {
          local_30 = *(int *)(in_RSI + 0xb4);
        }
        pvVar2 = (void *)(*(long *)(in_RDI + 0xa8) + (long)*(int *)(in_RDI + 0xb0));
        pvVar3 = (void *)(*(long *)(in_RSI + 0xa8) + (long)*(int *)(in_RSI + 0xb0));
        if ((local_30 < 2) ||
           (local_2c = memcmp(pvVar2,pvVar3,(long)local_30), local_4 = local_2c, local_2c == 0)) {
          if (*(int *)(in_RDI + 0xb4) < *(int *)(in_RSI + 0xb4)) {
            lVar4 = (long)local_30;
            local_30 = *(int *)(in_RSI + 0xb4) - *(int *)(in_RDI + 0xb4);
            pbVar1 = (byte *)((long)pvVar3 + lVar4);
            do {
              local_28 = pbVar1;
              if (local_30 == 0) goto LAB_001872de;
              local_30 = local_30 + -1;
              pbVar1 = local_28 + 1;
            } while (*local_28 == 0x20);
            local_4 = 0x20 - (uint)*local_28;
          }
          else if (*(int *)(in_RSI + 0xb4) < *(int *)(in_RDI + 0xb4)) {
            lVar4 = (long)local_30;
            local_30 = *(int *)(in_RDI + 0xb4) - *(int *)(in_RSI + 0xb4);
            pbVar1 = (byte *)((long)pvVar2 + lVar4);
            do {
              local_20 = pbVar1;
              if (local_30 == 0) goto LAB_001872de;
              local_30 = local_30 + -1;
              pbVar1 = local_20 + 1;
            } while (*local_20 == 0x20);
            local_4 = *local_20 - 0x20;
          }
          else {
LAB_001872de:
            local_4 = local_2c;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int
isoent_cmp_iso9660_identifier(const struct isoent *p1, const struct isoent *p2)
{
	const char *s1, *s2;
	int cmp;
	int l;

	s1 = p1->identifier;
	s2 = p2->identifier;

	/* Compare File Name */
	l = p1->ext_off;
	if (l > p2->ext_off)
		l = p2->ext_off;
	cmp = memcmp(s1, s2, l);
	if (cmp != 0)
		return (cmp);
	if (p1->ext_off < p2->ext_off) {
		s2 += l;
		l = p2->ext_off - p1->ext_off;
		while (l--)
			if (0x20 != *s2++)
				return (0x20
				    - *(const unsigned char *)(s2 - 1));
	} else if (p1->ext_off > p2->ext_off) {
		s1 += l;
		l = p1->ext_off - p2->ext_off;
		while (l--)
			if (0x20 != *s1++)
				return (*(const unsigned char *)(s1 - 1)
				    - 0x20);
	}
	/* Compare File Name Extension */
	if (p1->ext_len == 0 && p2->ext_len == 0)
		return (0);
	if (p1->ext_len == 1 && p2->ext_len == 1)
		return (0);
	if (p1->ext_len <= 1)
		return (-1);
	if (p2->ext_len <= 1)
		return (1);
	l = p1->ext_len;
	if (l > p2->ext_len)
		l = p2->ext_len;
	s1 = p1->identifier + p1->ext_off;
	s2 = p2->identifier + p2->ext_off;
	if (l > 1) {
		cmp = memcmp(s1, s2, l);
		if (cmp != 0)
			return (cmp);
	}
	if (p1->ext_len < p2->ext_len) {
		s2 += l;
		l = p2->ext_len - p1->ext_len;
		while (l--)
			if (0x20 != *s2++)
				return (0x20
				    - *(const unsigned char *)(s2 - 1));
	} else if (p1->ext_len > p2->ext_len) {
		s1 += l;
		l = p1->ext_len - p2->ext_len;
		while (l--)
			if (0x20 != *s1++)
				return (*(const unsigned char *)(s1 - 1)
				    - 0x20);
	}
	/* Compare File Version Number */
	/* No operation. The File Version Number is always one. */

	return (cmp);
}